

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O0

Variable * parse_variable(string *var)

{
  string_view fmt;
  runtime_error *this;
  ulong in_RSI;
  Variable *in_RDI;
  string name;
  string type;
  format_args in_stack_000000c0;
  size_t colon;
  Variable *v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  string local_160 [32];
  string local_140 [35];
  undefined1 local_11d;
  char *local_110 [2];
  string local_100 [32];
  long local_e0;
  ulong local_d8;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_c8 [3];
  undefined8 local_b0;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_a8;
  char *local_a0;
  size_t local_98;
  ulong local_90;
  char *local_88;
  size_t sStack_80;
  string *local_78;
  char *local_70;
  char **local_68;
  undefined8 *local_60;
  char *local_58;
  size_t sStack_50;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_48;
  undefined8 *local_40;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_38;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_30;
  undefined8 local_28;
  undefined8 *local_20;
  char *local_18;
  char **local_10;
  char *local_8;
  
  local_d8 = in_RSI;
  local_e0 = std::__cxx11::string::rfind((char)in_RSI,0x3a);
  if (local_e0 != -1) {
    std::__cxx11::string::substr((ulong)local_140,local_d8);
    std::__cxx11::string::substr((ulong)local_160,local_d8);
    std::__cxx11::string::string((string *)in_RDI,local_160);
    std::__cxx11::string::string((string *)&in_RDI->type,local_140);
    std::__cxx11::string::~string(local_160);
    std::__cxx11::string::~string(local_140);
    return in_RDI;
  }
  local_11d = 1;
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_68 = local_110;
  local_70 = "Couldn\'t find type of variable in {}\n";
  local_18 = "Couldn\'t find type of variable in {}\n";
  local_110[0] = "Couldn\'t find type of variable in {}\n";
  local_10 = local_68;
  local_98 = std::char_traits<char>::length((char_type *)0x180a6f);
  local_8 = local_70;
  local_78 = local_100;
  local_88 = local_110[0];
  local_90 = local_d8;
  local_60 = &local_88;
  local_a0 = local_110[0];
  sStack_80 = local_98;
  local_58 = local_a0;
  sStack_50 = local_98;
  local_c8[0] = ::fmt::v8::
                make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,std::__cxx11::string_const&>
                          (in_stack_fffffffffffffe68);
  local_40 = &local_b0;
  local_48 = local_c8;
  local_28 = 0xd;
  local_b0 = 0xd;
  fmt.size_ = (size_t)v;
  fmt.data_ = (char *)var;
  local_38 = local_48;
  local_30 = local_48;
  local_20 = local_40;
  local_a8 = local_48;
  ::fmt::v8::vformat_abi_cxx11_(fmt,in_stack_000000c0);
  std::runtime_error::runtime_error(this,local_100);
  local_11d = 0;
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Variable parse_variable(const std::string& var)
{
    // parse the variable
    size_t colon = var.rfind(':');
    if (colon == std::string::npos)
        throw std::runtime_error(fmt::format("Couldn't find type of variable in {}\n", var));

    std::string type = var.substr(colon+1);
    std::string name = var.substr(0,colon);

    Variable v = { name, type };
    return v;
}